

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O2

void absl::lts_20250127::log_internal::RemoveLogSink(LogSink *sink)

{
  __normal_iterator<absl::lts_20250127::LogSink_**,_std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>_>
  __position;
  WriterMutexLock global_sinks_lock;
  WriterMutexLock local_28;
  int local_20 [2];
  LogSink *local_18;
  
  anon_unknown_0::GlobalSinks();
  local_28.mu_ = (Mutex *)&anon_unknown_0::GlobalSinks::global_sinks;
  local_18 = sink;
  Mutex::Lock((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<absl::lts_20250127::LogSink**,std::vector<absl::lts_20250127::LogSink*,std::allocator<absl::lts_20250127::LogSink*>>>,__gnu_cxx::__ops::_Iter_equals_val<absl::lts_20250127::LogSink*const>>
                         (anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._8_8_,
                          anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_,&local_18);
  if (__position._M_current !=
      (LogSink **)anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_) {
    std::vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_>::
    erase((vector<absl::lts_20250127::LogSink_*,_std::allocator<absl::lts_20250127::LogSink_*>_> *)
          (anon_unknown_0::GlobalSinks::global_sinks.impl_.space_ + 8),
          (const_iterator)__position._M_current);
    WriterMutexLock::~WriterMutexLock(&local_28);
    return;
  }
  WriterMutexLock::~WriterMutexLock(&local_28);
  local_28.mu_ = (Mutex *)0x385a2c;
  local_20[1] = 3;
  local_20[0] = 0xe3;
  base_internal::
  AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::
  operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
              *)&raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)(local_20 + 1),
             (char **)&local_28,local_20,(char (*) [34])"Mismatched log sink being removed");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/log/internal/log_sink_set.cc"
                ,0xe3,
                "void absl::log_internal::(anonymous namespace)::GlobalLogSinkSet::RemoveLogSink(absl::LogSink *)"
               );
}

Assistant:

void RemoveLogSink(absl::LogSink* sink) {
  log_internal::GlobalSinks().RemoveLogSink(sink);
}